

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt_image::get_block_pixels
          (dxt_image *this,uint block_x,uint block_y,color_quad_u8 *pPixels)

{
  char cVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  dxt1_block *pDXT1_block;
  dxt3_block *this_00;
  color_quad_u8 colors [4];
  bool local_61;
  color_quad_u8 local_58 [10];
  
  uVar8 = this->m_num_elements_per_block;
  uVar10 = (ulong)uVar8;
  if (uVar8 == 0) {
    local_61 = true;
  }
  else {
    this_00 = (dxt3_block *)(this->m_pElements + (this->m_blocks_x * block_y + block_x) * uVar8);
    local_61 = true;
    uVar9 = 0;
    do {
      iVar5 = (int)uVar10;
      iVar2 = (int)uVar9;
      switch(this->m_element_type[uVar9]) {
      case cColorDXT1:
        dxt1_block::get_block_colors
                  (local_58,*(uint16 *)this_00->m_alpha,*(uint16 *)(this_00->m_alpha + 2));
        bVar3 = 0;
        uVar10 = 0;
        do {
          uVar8 = this_00->m_alpha[(uVar10 >> 2 & 0x3fffffff) + 4] >> (bVar3 & 6) & 3;
          pPixels[uVar10].field_0.field_0.r = local_58[uVar8].field_0.field_0.r;
          pPixels[uVar10].field_0.field_0.g = local_58[uVar8].field_0.field_0.g;
          pPixels[uVar10].field_0.field_0.b = local_58[uVar8].field_0.field_0.b;
          if (this->m_format < cDXT3) {
            pPixels[uVar10].field_0.field_0.a = local_58[uVar8].field_0.field_0.a;
          }
          uVar10 = uVar10 + 1;
          bVar3 = bVar3 + 2;
        } while (uVar10 != 0x10);
        break;
      case cAlphaDXT3:
        cVar1 = this->m_element_component_index[uVar9];
        uVar10 = 0;
        do {
          uVar6 = dxt3_block::get_alpha
                            (this_00,(uint)uVar10 & 3,(uint)(uVar10 >> 2) & 0x3fffffff,true);
          pPixels[uVar10].field_0.c[(uint)(int)cVar1] = (uchar)uVar6;
          uVar10 = uVar10 + 1;
        } while (uVar10 != 0x10);
        break;
      case cAlphaDXT5:
        dxt5_block::get_block_values
                  ((uint *)local_58,(uint)this_00->m_alpha[0],(uint)this_00->m_alpha[1]);
        cVar1 = this->m_element_component_index[uVar9];
        uVar8 = 0;
        uVar10 = 0;
        do {
          uVar7 = (uint)this_00->m_alpha[(ulong)(uVar8 >> 3) + 2];
          if (uVar10 < 0xe) {
            uVar7 = (uint)CONCAT11(this_00->m_alpha[(ulong)(uVar8 >> 3) + 3],
                                   this_00->m_alpha[(ulong)(uVar8 >> 3) + 2]);
          }
          pPixels[uVar10].field_0.c[(uint)(int)cVar1] =
               local_58[uVar7 >> ((byte)uVar8 & 7) & 7].field_0.field_0.r;
          uVar10 = uVar10 + 1;
          uVar8 = uVar8 + 3;
        } while (uVar10 != 0x10);
        break;
      case cColorETC1:
        bVar4 = rg_etc1::unpack_etc1_block
                          (this->m_pElements +
                           ((this->m_blocks_x * block_y + block_x) * iVar5 + iVar2),(uint *)pPixels,
                           this->m_format != cETC1);
        goto LAB_0018af73;
      case cColorETC2:
        bVar4 = rg_etc1::unpack_etc2_color
                          (this->m_pElements +
                           ((this->m_blocks_x * block_y + block_x) * iVar5 + iVar2),(uint *)pPixels,
                           this->m_format != cETC2);
        goto LAB_0018af73;
      case cAlphaETC2:
        bVar4 = rg_etc1::unpack_etc2_alpha
                          (this->m_pElements +
                           ((this->m_blocks_x * block_y + block_x) * iVar5 + iVar2),(uint *)pPixels,
                           (int)this->m_element_component_index[uVar9]);
LAB_0018af73:
        local_61 = (bool)(local_61 & bVar4);
      }
      uVar9 = uVar9 + 1;
      this_00 = this_00 + 1;
      uVar10 = (ulong)this->m_num_elements_per_block;
    } while (uVar9 < uVar10);
  }
  return local_61;
}

Assistant:

bool dxt_image::get_block_pixels(uint block_x, uint block_y, color_quad_u8* pPixels) const
    {
        bool success = true;
        const element* pElement = &get_element(block_x, block_y, 0);

        for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
        {
            switch (m_element_type[element_index])
            {
            case cColorETC1:
            {
                const etc1_block& block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
// Preserve alpha if the format is something weird (like ETC1 for color and DXT5A for alpha) - which isn't currently supported.
#if CRNLIB_USE_RG_ETC1
                if (!rg_etc1::unpack_etc1_block(&block, (uint32*)pPixels, m_format != cETC1))
                {
                    success = false;
                }
#else
                if (!unpack_etc1(block, pPixels, m_format != cETC1))
                {
                    success = false;
                }
#endif

                break;
            }
            case cColorETC2:
            {
                const etc1_block& block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
                if (!rg_etc1::unpack_etc2_color(&block, (uint32*)pPixels, m_format != cETC2))
                {
                    success = false;
                }
                break;
            }
            case cAlphaETC2:
            {
                const etc1_block& block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
                if (!rg_etc1::unpack_etc2_alpha(&block, (uint32*)pPixels, m_element_component_index[element_index]))
                {
                    success = false;
                }
                break;
            }
            case cColorDXT1:
            {
                const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pElement);

                color_quad_u8 colors[cDXT1SelectorValues];
                pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                {
                    uint s = pDXT1_block->get_selector(i & 3, i >> 2);

                    pPixels[i].r = colors[s].r;
                    pPixels[i].g = colors[s].g;
                    pPixels[i].b = colors[s].b;

                    if (m_format <= cDXT1A)
                    {
                        pPixels[i].a = colors[s].a;
                    }
                }

                break;
            }
            case cAlphaDXT5:
            {
                const dxt5_block* pDXT5_block = reinterpret_cast<const dxt5_block*>(pElement);

                uint values[cDXT5SelectorValues];
                dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

                const int comp_index = m_element_component_index[element_index];

                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                {
                    uint s = pDXT5_block->get_selector(i & 3, i >> 2);

                    pPixels[i][comp_index] = static_cast<uint8>(values[s]);
                }

                break;
            }
            case cAlphaDXT3:
            {
                const dxt3_block* pDXT3_block = reinterpret_cast<const dxt3_block*>(pElement);

                const int comp_index = m_element_component_index[element_index];

                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                {
                    uint a = pDXT3_block->get_alpha(i & 3, i >> 2, true);

                    pPixels[i][comp_index] = static_cast<uint8>(a);
                }

                break;
            }
            default:
                break;
            }
        } // element_index
        return success;
    }